

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O0

int __thiscall AliHttpRequest::CommitRequest(AliHttpRequest *this)

{
  AliConnection *pAVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  mapped_type *pmVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  AliTlsConnection *this_00;
  char *pcVar9;
  ulong uVar10;
  AliTcpConnection *this_01;
  long lVar11;
  string local_1e8;
  string local_1c8 [32];
  string local_1a8 [32];
  long local_188;
  size_t pos;
  string local_178 [4];
  int port;
  string host;
  string local_150;
  _Base_ptr local_130;
  _Self local_128;
  _Self local_120;
  iterator it;
  string req;
  string path;
  key_type local_d0;
  allocator<char> local_a9;
  key_type local_a8;
  string local_88;
  _Self local_68;
  byte local_5d;
  byte local_4a;
  allocator<char> local_49;
  key_type local_48;
  _Self local_28;
  byte local_19;
  AliHttpRequest *pAStack_18;
  bool with_query;
  AliHttpRequest *this_local;
  
  local_19 = 1;
  pAStack_18 = this;
  bVar2 = std::operator==(&this->method_,"POST");
  local_4a = 0;
  local_5d = 0;
  bVar3 = false;
  if (bVar2) {
    std::allocator<char>::allocator();
    local_4a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Content-Length",&local_49);
    local_5d = 1;
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->map_request_headers_,&local_48);
    local_68._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->map_request_headers_);
    bVar2 = std::operator==(&local_28,&local_68);
    bVar3 = false;
    if (bVar2) {
      lVar11 = std::__cxx11::string::size();
      bVar3 = lVar11 != 0;
    }
  }
  if ((local_5d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_48);
  }
  if ((local_4a & 1) != 0) {
    std::allocator<char>::~allocator(&local_49);
  }
  if (bVar3) {
    local_19 = 0;
    uVar7 = std::__cxx11::string::size();
    get_format_string_abi_cxx11_(&local_88,"%d",uVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"Content-Length",&local_a9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->map_request_headers_,&local_a8);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"Content-Type",
               (allocator<char> *)(path.field_2._M_local_buf + 0xf));
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->map_request_headers_,&local_d0);
    std::__cxx11::string::operator=((string *)pmVar6,"application/x-www-form-urlencoded");
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)(path.field_2._M_local_buf + 0xf));
  }
  GetPath_abi_cxx11_((string *)((long)&req.field_2 + 8),this,(bool)(local_19 & 1));
  uVar7 = std::__cxx11::string::c_str();
  uVar8 = std::__cxx11::string::c_str();
  get_format_string_abi_cxx11_((string *)&it,"%s %s HTTP/1.1\r\n",uVar7,uVar8);
  local_120._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(&this->map_request_headers_);
  while( true ) {
    local_128._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->map_request_headers_);
    bVar3 = std::operator!=(&local_120,&local_128);
    if (!bVar3) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_120);
    uVar7 = std::__cxx11::string::c_str();
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_120);
    uVar8 = std::__cxx11::string::c_str();
    append_format_string((string *)&it,"%s: %s\r\n",uVar7,uVar8);
    local_130 = (_Base_ptr)
                std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator++(&local_120,0);
  }
  std::__cxx11::string::append((char *)&it);
  if ((this->is_tls & 1U) == 0) {
    std::__cxx11::string::string(local_178,(string *)&this->host_);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    pos._4_4_ = atoi(pcVar9);
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      local_188 = std::__cxx11::string::find((char *)&this->proxy_host_,0x1e6945);
      if (local_188 == -1) {
        std::__cxx11::string::operator=(local_178,(string *)&this->proxy_host_);
        pos._4_4_ = 0x50;
      }
      else {
        std::__cxx11::string::substr((ulong)local_1a8,(ulong)&this->proxy_host_);
        std::__cxx11::string::operator=(local_178,local_1a8);
        std::__cxx11::string::~string(local_1a8);
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_1c8,(ulong)&this->proxy_host_);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        pos._4_4_ = atoi(pcVar9);
        std::__cxx11::string::~string(local_1c8);
      }
    }
    this_01 = (AliTcpConnection *)operator_new(0x38);
    std::__cxx11::string::string((string *)&local_1e8,local_178);
    AliTcpConnection::AliTcpConnection(this_01,&local_1e8,pos._4_4_);
    this->connection_ = (AliConnection *)this_01;
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string(local_178);
  }
  else {
    this_00 = (AliTlsConnection *)operator_new(0xb08);
    host.field_2._M_local_buf[0xf] = '\x01';
    std::__cxx11::string::string((string *)&local_150,(string *)&this->host_);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    iVar4 = atoi(pcVar9);
    AliTlsConnection::AliTlsConnection(this_00,&local_150,iVar4);
    host.field_2._M_local_buf[0xf] = '\0';
    this->connection_ = (AliConnection *)this_00;
    std::__cxx11::string::~string((string *)&local_150);
  }
  iVar4 = (**this->connection_->_vptr_AliConnection)();
  if (iVar4 == 0) {
    pAVar1 = this->connection_;
    uVar7 = std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::size();
    iVar4 = (*pAVar1->_vptr_AliConnection[1])(pAVar1,uVar7,(ulong)uVar5);
    if (iVar4 < 1) {
      this_local._4_4_ = -1;
    }
    else {
      bVar3 = std::operator==(&this->method_,"POST");
      if ((bVar3) && (lVar11 = std::__cxx11::string::size(), lVar11 != 0)) {
        pAVar1 = this->connection_;
        uVar7 = std::__cxx11::string::c_str();
        uVar5 = std::__cxx11::string::size();
        iVar4 = (*pAVar1->_vptr_AliConnection[1])(pAVar1,uVar7,(ulong)uVar5);
        if (iVar4 < 1) {
          this_local._4_4_ = -1;
          goto LAB_0016df1c;
        }
      }
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
LAB_0016df1c:
  std::__cxx11::string::~string((string *)&it);
  std::__cxx11::string::~string((string *)(req.field_2._M_local_buf + 8));
  return this_local._4_4_;
}

Assistant:

int AliHttpRequest::CommitRequest() {
  bool with_query = true;  

  // if content-length is not setted, we assume no body
  // put the query into body,and add Content-Type header
  if(this->method_ == "POST" 
     && this->map_request_headers_.find("Content-Length") == this->map_request_headers_.end()
     && this->query_.size() > 0) {
    with_query = false;
    this->map_request_headers_["Content-Length"] = get_format_string("%d", this->query_.size());
    this->map_request_headers_["Content-Type"] = "application/x-www-form-urlencoded";
  }
  std::string path = GetPath(with_query); 

  std::string req = get_format_string("%s %s HTTP/1.1\r\n", this->method_.c_str(),  path.c_str());
  for(std::map<std::string, std::string>::iterator it = map_request_headers_.begin();
      it != map_request_headers_.end(); it++) {
    append_format_string(req, "%s: %s\r\n", it->first.c_str(), it->second.c_str());
  }
  req.append("\r\n");

  ALI_LOG("request=\n%s", req.c_str());

  if(this->is_tls) {
    connection_ = new AliTlsConnection(this->host_, atoi(this->port_.c_str()));
  } else {
    std::string host = this->host_;
    int port = atoi(this->port_.c_str());
    if(!this->proxy_host_.empty()) {
        size_t pos = this->proxy_host_.find(":");
        if(pos == std::string::npos) {
          host = this->proxy_host_;
          port = 80;
        } else {
          host = this->proxy_host_.substr(0, pos);
          port = atoi(this->proxy_host_.substr(pos + 1, this->proxy_host_.size() - pos - 1).c_str());
        }
    }
    ALI_LOG("host=%s,port=%d", host.c_str(), port);
    connection_ = new AliTcpConnection(host, port);
  }

  if(connection_->Connect() != 0) {
    return -1;
  }

  if(connection_->Send((char*)req.c_str(), req.size()) <= 0) {
    return -1;
  }
  if(this->method_ == "POST" && this->query_.size() > 0) {
     if(connection_->Send((char*)this->query_.c_str(), this->query_.size()) <= 0) {
      return -1;
    }
  }
  return 0;
}